

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void heightOfExprList(ExprList *p,int *pnHeight)

{
  int local_1c;
  int i;
  int *pnHeight_local;
  ExprList *p_local;
  
  if (p != (ExprList *)0x0) {
    for (local_1c = 0; local_1c < p->nExpr; local_1c = local_1c + 1) {
      heightOfExpr(p->a[local_1c].pExpr,pnHeight);
    }
  }
  return;
}

Assistant:

static void heightOfExprList(const ExprList *p, int *pnHeight){
  if( p ){
    int i;
    for(i=0; i<p->nExpr; i++){
      heightOfExpr(p->a[i].pExpr, pnHeight);
    }
  }
}